

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

ReturnType __thiscall
pbrt::ParameterDictionary::lookupSingle<(pbrt::ParameterType)6>
          (ParameterDictionary *this,string *name,ReturnType defaultValue)

{
  ParsedParameter *param;
  Tuple3<pbrt::Vector3,_float> TVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_00;
  size_t sVar3;
  char *in_RSI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [64];
  float in_XMM1_Da;
  Vector3f VVar6;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *values;
  ParsedParameter *p;
  const_iterator __end2;
  const_iterator __begin2;
  ParsedParameterVector *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  Float *in_stack_ffffffffffffff90;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *loc;
  undefined8 local_c;
  float local_4;
  undefined1 auVar5 [56];
  
  local_c = vmovlpd_avx(in_ZMM0._0_16_);
  loc = in_RDI;
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
           ::begin(in_RDI);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
         ::end(in_stack_ffffffffffffff80);
  do {
    local_4 = in_XMM1_Da;
    if (args_1 == args) {
LAB_004e4553:
      TVar1.z = local_4;
      TVar1.x = (float)(undefined4)local_c;
      TVar1.y = (float)local_c._4_4_;
      return (ReturnType)TVar1;
    }
    param = *(ParsedParameter **)args_1;
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (!bVar2) {
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
      auVar5 = in_ZMM0._8_56_;
      if (!bVar2) {
        this_00 = ParameterTypeTraits<(pbrt::ParameterType)6>::GetValues(param);
        bVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::empty
                          ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)0x4e4490);
        if (bVar2) {
          ErrorExit<std::__cxx11::string_const&>((FileLoc *)in_RDI,(char *)args_1,args);
        }
        sVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(this_00);
        if (sVar3 != 3) {
          ErrorExit<int_const&,std::__cxx11::string_const&>
                    ((FileLoc *)loc,in_RSI,(int *)in_RDI,args_1);
        }
        param->lookedUp = true;
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data(this_00);
        VVar6 = ParameterTypeTraits<(pbrt::ParameterType)6>::Convert
                          (in_stack_ffffffffffffff90,
                           (FileLoc *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
        ;
        local_4 = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar4._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar4._8_56_ = auVar5;
        local_c = vmovlpd_avx(auVar4._0_16_);
        goto LAB_004e4553;
      }
    }
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &args_1->_M_string_length;
  } while( true );
}

Assistant:

typename ParameterTypeTraits<PT>::ReturnType ParameterDictionary::lookupSingle(
    const std::string &name,
    typename ParameterTypeTraits<PT>::ReturnType defaultValue) const {
    // Search _params_ for parameter _name_
    using traits = ParameterTypeTraits<PT>;
    for (const ParsedParameter *p : params) {
        if (p->name != name || p->type != traits::typeName)
            continue;
        // Extract parameter values from _p_
        const auto &values = traits::GetValues(*p);

        // Issue error if an incorrect number of parameter values were provided
        if (values.empty())
            ErrorExit(&p->loc, "No values provided for parameter \"%s\".", name);
        if (values.size() != traits::nPerItem)
            ErrorExit(&p->loc, "Expected %d values for parameter \"%s\".",
                      traits::nPerItem, name);

        // Return parameter values as _ReturnType_
        p->lookedUp = true;
        return traits::Convert(values.data(), &p->loc);
    }

    return defaultValue;
}